

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O0

int Llb_ManTracePaths(Aig_Man_t *p,Aig_Obj_t *pPivot)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pPivot_local;
  Aig_Man_t *p_local;
  
  local_28 = 0;
  Aig_ManIncrementTravId(p);
  Aig_ManIncrementTravId(p);
  for (local_24 = 0; iVar1 = Saig_ManRegNum(p), local_24 < iVar1; local_24 = local_24 + 1) {
    p_00 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_24 + iVar1);
    iVar1 = Llb_ManTracePaths_rec(p,pObj_00,pPivot);
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

int Llb_ManTracePaths( Aig_Man_t * p, Aig_Obj_t * pPivot )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManIncrementTravId( p ); // prev = visited with path to LI  (value 0)
    Aig_ManIncrementTravId( p ); // cur  = visited w/o  path to LI  (value 1)
    Saig_ManForEachLo( p, pObj, i )
        Counter += Llb_ManTracePaths_rec( p, pObj, pPivot );
    return Counter;
}